

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

bool nuraft::raft_server::apply_config_log_entry
               (ptr<log_entry> *le,ptr<state_mgr> *s_mgr,string *err_msg)

{
  log_entry *this;
  element_type *peVar1;
  buffer *this_00;
  ptr<cluster_config> pVar2;
  ptr<cluster_config> new_conf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this = (le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this != (log_entry *)0x0) &&
     ((s_mgr->super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0)) {
    if (this->value_type_ != 2) {
      std::__cxx11::to_string(&local_38,(uint)this->value_type_);
      std::operator+(&local_58,"Invalid log type: ",&local_38);
      std::__cxx11::string::operator=((string *)err_msg,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      return false;
    }
    if ((this->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_00 = log_entry::get_buf(this);
      buffer::pos(this_00,0);
      pVar2 = cluster_config::deserialize((cluster_config *)&local_58,this_00);
      peVar1 = (s_mgr->super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar1->_vptr_state_mgr[3])
                (peVar1,local_58._M_dataplus._M_p,
                 pVar2.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
      return true;
    }
  }
  std::__cxx11::string::assign((char *)err_msg);
  return false;
}

Assistant:

bool raft_server::apply_config_log_entry(ptr<log_entry>& le,
                                         ptr<state_mgr>& s_mgr,
                                         std::string& err_msg)
{
    if (!le.get() || !s_mgr.get()) {
        err_msg = "Invalid arguments";
        return false;
    }
    if (le->get_val_type() != log_val_type::conf) {
        err_msg = "Invalid log type: " + std::to_string(le->get_val_type());
        return false;
    }
    if (le->is_buf_null()) {
        err_msg = "Context is empty";
        return false;
    }

    buffer& buf = le->get_buf();
    buf.pos(0);
    ptr<cluster_config> new_conf = cluster_config::deserialize(buf);
    s_mgr->save_config(*new_conf);
    return true;
}